

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O0

int32 senone_mgau_map_read(senone_t *s,char *file_name)

{
  int32 iVar1;
  int iVar2;
  size_t sVar3;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  float local_4c;
  char **ppcStack_48;
  float32 v;
  char **argval;
  char **argname;
  uint32 uStack_30;
  char eofchk;
  int32 i;
  uint32 chksum;
  int32 n_mgau_present;
  int32 chksum_present;
  int32 byteswap;
  FILE *fp;
  char *file_name_local;
  senone_t *s_local;
  
  fp = (FILE *)file_name;
  file_name_local = (char *)s;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,0x4a,"Reading senone-codebook map file: %s\n",file_name);
  _chksum_present = fopen((char *)fp,"rb");
  if (_chksum_present == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                   ,0x4d,"fopen(%s,rb) failed\n",fp);
    exit(1);
  }
  iVar1 = bio_readhdr((FILE *)_chksum_present,&argval,&stack0xffffffffffffffb8,&n_mgau_present);
  if (iVar1 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x51,"bio_readhdr(%s) failed\n",fp);
    exit(1);
  }
  chksum = 0;
  i = 0;
  for (argname._4_4_ = 0; uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
      argval[(int)argname._4_4_] != (char *)0x0; argname._4_4_ = argname._4_4_ + 1) {
    iVar2 = strcmp(argval[(int)argname._4_4_],"version");
    if (iVar2 == 0) {
      iVar2 = strcmp(ppcStack_48[(int)argname._4_4_],"1.2");
      if (iVar2 != 0) {
        in_stack_ffffffffffffffa8 = 0;
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0x5a,"Version mismatch(%s): %s, expecting %s\n",fp,ppcStack_48[(int)argname._4_4_],
                "1.2");
      }
      iVar2 = __isoc99_sscanf(ppcStack_48[(int)argname._4_4_],"%f",&local_4c);
      if (iVar2 != 1) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0x5f,"%s: Bad version no. string: %s\n",fp,ppcStack_48[(int)argname._4_4_]);
        exit(1);
      }
      i = (int32)(1.1 < local_4c);
    }
    else {
      iVar2 = strcmp(argval[(int)argname._4_4_],"chksum0");
      if (iVar2 == 0) {
        chksum = 1;
      }
    }
  }
  bio_hdrarg_free(argval,ppcStack_48);
  ppcStack_48 = (char **)0x0;
  argval = (char **)0x0;
  uStack_30 = 0;
  if ((i != 0) &&
     (iVar1 = bio_fread(file_name_local + 8,4,1,(FILE *)_chksum_present,n_mgau_present,
                        &stack0xffffffffffffffd0), iVar1 != 1)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x6e,"fread(%s) (#gauden) failed\n",fp);
    exit(1);
  }
  iVar1 = bio_fread_1d((void **)(file_name_local + 0x18),4,(uint32 *)file_name_local,
                       (FILE *)_chksum_present,n_mgau_present,&stack0xffffffffffffffd0);
  if (iVar1 < 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x74,"bio_fread_1d(%s) failed\n",fp);
    exit(1);
  }
  if (i == 0) {
    file_name_local[8] = '\x01';
    file_name_local[9] = '\0';
    file_name_local[10] = '\0';
    file_name_local[0xb] = '\0';
    for (argname._4_4_ = 0; argname._4_4_ < *(uint *)file_name_local;
        argname._4_4_ = argname._4_4_ + 1) {
      if (*(uint *)(file_name_local + 8) <=
          *(uint *)(*(long *)(file_name_local + 0x18) + (long)(int)argname._4_4_ * 4)) {
        *(int *)(file_name_local + 8) =
             *(int *)(*(long *)(file_name_local + 0x18) + (long)(int)argname._4_4_ * 4) + 1;
      }
    }
  }
  if (0x7ffe < *(uint *)file_name_local) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x81,"%s: #senones (%d) exceeds limit (%d)\n",fp,(ulong)*(uint *)file_name_local,
            CONCAT44(uVar4,0x7fff));
    exit(1);
  }
  if (0x7ffe < *(uint *)(file_name_local + 8)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x83,"%s: #gauden (%d) exceeds limit (%d)\n",fp,(ulong)*(uint *)(file_name_local + 8),
            CONCAT44(uVar4,0x7fff));
    exit(1);
  }
  for (argname._4_4_ = 0; argname._4_4_ < *(uint *)file_name_local;
      argname._4_4_ = argname._4_4_ + 1) {
    if (*(uint *)(file_name_local + 8) <=
        *(uint *)(*(long *)(file_name_local + 0x18) + (long)(int)argname._4_4_ * 4)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
              ,0x89,"Bad sen2mgau[%d]= %d, out of range [0, %d)\n",(ulong)argname._4_4_,
              (ulong)*(uint *)(*(long *)(file_name_local + 0x18) + (long)(int)argname._4_4_ * 4),
              CONCAT44(uVar4,*(undefined4 *)(file_name_local + 8)));
      exit(1);
    }
  }
  if (chksum != 0) {
    bio_verify_chksum((FILE *)_chksum_present,n_mgau_present,uStack_30);
  }
  sVar3 = fread((void *)((long)&argname + 3),1,1,_chksum_present);
  if (sVar3 != 1) {
    fclose(_chksum_present);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x94,"Read %d->%d senone-codebook mappings\n",(ulong)*(uint *)file_name_local,
            (ulong)*(uint *)(file_name_local + 8));
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,0x90,"More data than expected in %s\n",fp);
  exit(1);
}

Assistant:

static int32 senone_mgau_map_read (senone_t *s, const char *file_name)
{
    FILE *fp;
    int32 byteswap, chksum_present, n_mgau_present;
    uint32 chksum;
    int32 i;
    char eofchk;
    char **argname, **argval;
    float32 v;
    
    E_INFO("Reading senone-codebook map file: %s\n", file_name);
    
    if ((fp = fopen(file_name, "rb")) == NULL)
	E_FATAL_SYSTEM("fopen(%s,rb) failed\n", file_name);
    
    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr (fp, &argname, &argval, &byteswap) < 0)
	E_FATAL("bio_readhdr(%s) failed\n", file_name);
    
    /* Parse argument-value list */
    chksum_present = 0;
    n_mgau_present = 0;
    for (i = 0; argname[i]; i++) {
	if (strcmp (argname[i], "version") == 0) {
	    if (strcmp(argval[i], SPDEF_PARAM_VERSION) != 0) {
		E_WARN("Version mismatch(%s): %s, expecting %s\n",
		       file_name, argval[i], SPDEF_PARAM_VERSION);
	    }
	    
	    /* HACK!! Convert version# to float32 and take appropriate action */
	    if (sscanf (argval[i], "%f", &v) != 1)
		E_FATAL("%s: Bad version no. string: %s\n", file_name, argval[i]);

	    n_mgau_present = (v > 1.1) ? 1 : 0;
	} else if (strcmp (argname[i], "chksum0") == 0) {
	    chksum_present = 1;	/* Ignore the associated value */
	}
    }
    bio_hdrarg_free (argname, argval);
    argname = argval = NULL;

    chksum = 0;
    
    /* Read #gauden (if version matches) */
    if (n_mgau_present) {
	if (bio_fread (&(s->n_mgau), sizeof(int32), 1, fp, byteswap, &chksum) != 1)
	    E_FATAL("fread(%s) (#gauden) failed\n", file_name);
    }
    
    /* Read 1d array data; s->sen2mgau allocated by called function */
    if (bio_fread_1d ((void **)(&s->sen2mgau), sizeof(int32), &(s->n_sen), fp,
		      byteswap, &chksum) < 0) {
	E_FATAL("bio_fread_1d(%s) failed\n", file_name);
    }
    
    /* Infer n_mgau if not present in this version */
    if (! n_mgau_present) {
	s->n_mgau = 1;
	for (i = 0; i < s->n_sen; i++) {
	    if (s->sen2mgau[i] >= s->n_mgau)
		s->n_mgau = s->sen2mgau[i]+1;
	}
    }
    
    if (s->n_sen >= MAX_SENID)
	E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", file_name, s->n_sen, MAX_SENID);
    if (s->n_mgau >= MAX_MGAUID)
	E_FATAL("%s: #gauden (%d) exceeds limit (%d)\n", file_name, s->n_mgau, MAX_MGAUID);

    /* Check for validity of mappings */
    for (i = 0; i < s->n_sen; i++) {
	if ((s->sen2mgau[i] >= s->n_mgau) || NOT_MGAUID(s->sen2mgau[i]))
	    E_FATAL("Bad sen2mgau[%d]= %d, out of range [0, %d)\n",
		    i, s->sen2mgau[i], s->n_mgau);
    }
    
    if (chksum_present)
	bio_verify_chksum (fp, byteswap, chksum);
    
    if (fread (&eofchk, 1, 1, fp) == 1)
	E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    E_INFO("Read %d->%d senone-codebook mappings\n", s->n_sen, s->n_mgau);

    return 0;
}